

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.h
# Opt level: O0

Maybe<char> __thiscall
kj::parse::CharGroup_::operator()(CharGroup_ *this,IteratorInput<char,_const_char_*> *input)

{
  bool bVar1;
  uchar *puVar2;
  IteratorInput<char,_const_char_*> *in_RDX;
  uchar local_22;
  uchar local_21;
  IteratorInput<char,_const_char_*> *pIStack_20;
  uchar c;
  IteratorInput<char,_const_char_*> *input_local;
  CharGroup_ *this_local;
  
  pIStack_20 = in_RDX;
  input_local = input;
  this_local = this;
  bVar1 = IteratorInput<char,_const_char_*>::atEnd(in_RDX);
  if (bVar1) {
    Maybe<char>::Maybe((Maybe<char> *)this,(void *)0x0);
  }
  else {
    puVar2 = (uchar *)IteratorInput<char,_const_char_*>::current(pIStack_20);
    local_21 = *puVar2;
    bVar1 = contains((CharGroup_ *)input,local_21);
    if (bVar1) {
      IteratorInput<char,_const_char_*>::next(pIStack_20);
      local_22 = local_21;
      Maybe<char>::Maybe((Maybe<char> *)this,(char *)&local_22);
    }
    else {
      Maybe<char>::Maybe((Maybe<char> *)this,(void *)0x0);
    }
  }
  return (Maybe<char>)SUB82(this,0);
}

Assistant:

Maybe<char> operator()(Input& input) const {
    if (input.atEnd()) return nullptr;
    unsigned char c = input.current();
    if (contains(c)) {
      input.next();
      return c;
    } else {
      return nullptr;
    }
  }